

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

void pstore::serialize::flood<_1l>(span<unsigned_char,__1L> sp)

{
  uchar uVar1;
  reference ptVar2;
  ulong in_RDI;
  ulong uVar3;
  long lVar4;
  iterator it;
  iterator end;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> ret;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_60;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_40;
  span<unsigned_char,__1L> local_30;
  
  local_30.storage_.super_extent_type<_1L>.size_ = in_RDI;
  gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
            (&local_60,&local_30,0);
  gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
            (&local_50,&local_30,local_30.storage_.super_extent_type<_1L>.size_);
  if (3 < local_30.storage_.super_extent_type<_1L>.size_) {
    lVar4 = ((ulong)local_30.storage_.super_extent_type<_1L>.size_ >> 2) + 1;
    do {
      gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
                (&local_40,local_60.span_,local_60.index_);
      gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
                (&local_60);
      ptVar2 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                         (&local_40);
      *ptVar2 = 0xde;
      gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
                (&local_40,local_60.span_,local_60.index_);
      gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
                (&local_60);
      ptVar2 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                         (&local_40);
      *ptVar2 = 0xad;
      gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
                (&local_40,local_60.span_,local_60.index_);
      gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
                (&local_60);
      ptVar2 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                         (&local_40);
      *ptVar2 = 0xbe;
      gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
                (&local_40,local_60.span_,local_60.index_);
      gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
                (&local_60);
      ptVar2 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                         (&local_40);
      *ptVar2 = 0xef;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  if ((local_60.span_ != local_50.span_) || (local_60.index_ != local_50.index_)) {
    uVar3 = 0;
    do {
      do {
        uVar1 = flood<-1L>::deadbeef._M_elems[uVar3];
        ptVar2 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
                 operator*(&local_60);
        *ptVar2 = uVar1;
        uVar3 = (ulong)((int)uVar3 + 1U & 3);
        gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
                  (&local_60);
      } while (local_60.span_ != local_50.span_);
    } while (local_60.index_ != local_50.index_);
  }
  return;
}

Assistant:

void flood (gsl::span<std::uint8_t, SpanExtent> sp) noexcept {
            static std::array<std::uint8_t, 4> const deadbeef{{0xDE, 0xAD, 0xBE, 0xEF}};

            auto it = std::begin (sp);
            auto end = std::end (sp);

            for (auto uint32_count = sp.size () / 4U; uint32_count > 0U; --uint32_count) {
                *(it++) = deadbeef[0];
                *(it++) = deadbeef[1];
                *(it++) = deadbeef[2];
                *(it++) = deadbeef[3];
            }

            auto index = std::size_t{0};
            for (; it != end; ++it) {
                *it = deadbeef.at (index);
                index = (index + 1) % deadbeef.size ();
            }
        }